

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  seqDef *psVar3;
  bool bVar4;
  undefined8 uVar5;
  seqStore_t *psVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  int *mEnd;
  BYTE *pBVar13;
  uint uVar14;
  int *piVar15;
  BYTE *pBVar16;
  int iVar17;
  int *piVar18;
  ulong uVar19;
  int *piVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  size_t ofbCandidate;
  int *local_f0;
  size_t local_d8;
  ulong local_d0;
  seqStore_t *local_c8;
  int *local_c0;
  ulong local_b8;
  BYTE *local_b0;
  uint local_a8;
  uint local_a4;
  int *local_a0;
  BYTE *local_98;
  BYTE *local_90;
  BYTE *local_88;
  int *local_80;
  uint local_74;
  int *local_70;
  BYTE *local_68;
  uint *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_b0 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_d0 = (ulong)uVar8;
  uVar9 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar9 < 6) {
    uVar7 = uVar9;
  }
  local_a8 = 4;
  if (4 < uVar7) {
    local_a8 = uVar7;
  }
  local_98 = local_b0 + local_d0;
  uVar9 = *rep;
  pZVar2 = ms->dictMatchState;
  local_a0 = (int *)(pZVar2->window).nextSrc;
  local_88 = (pZVar2->window).base;
  local_68 = local_88 + (pZVar2->window).dictLimit;
  iVar17 = (int)local_a0;
  uVar7 = ((int)src - ((int)local_98 + (int)local_68)) + iVar17;
  piVar18 = (int *)((long)src + (ulong)(uVar7 == 0));
  if (uVar7 < uVar9) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar14 = rep[1];
  if (uVar7 < uVar14) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  local_f0 = (int *)src;
  if (piVar18 < local_80) {
    local_74 = ((int)local_88 - iVar17) + uVar8;
    local_90 = local_88 + -(ulong)local_74;
    local_70 = iEnd + -8;
    iVar12 = (int)local_b0;
    local_48 = (ulong)((1 - uVar8) - iVar12);
    local_50 = (ulong)(uint)-iVar12;
    local_58 = (ulong)((((iVar17 - uVar8) - (int)local_88) - iVar12) + 1);
    local_c8 = seqStore;
    local_60 = rep;
    do {
      local_c0 = (int *)((long)piVar18 + 1);
      iVar17 = (int)piVar18;
      uVar8 = ((iVar17 - (int)local_b0) - uVar9) + 1;
      piVar15 = (int *)(local_b0 + uVar8);
      if (uVar8 < (uint)local_d0) {
        piVar15 = (int *)(local_88 + (uVar8 - local_74));
      }
      local_a4 = uVar14;
      if ((uVar8 - (uint)local_d0 < 0xfffffffd) && (*piVar15 == *local_c0)) {
        piVar20 = iEnd;
        if (uVar8 < (uint)local_d0) {
          piVar20 = local_a0;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar15 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar20,local_98);
        uVar19 = sVar10 + 4;
      }
      else {
        uVar19 = 0;
      }
      local_d8 = 999999999;
      if (local_a8 == 6) {
        uVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                           (ms,(BYTE *)piVar18,(BYTE *)iEnd,&local_d8);
      }
      else if (local_a8 == 5) {
        uVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                           (ms,(BYTE *)piVar18,(BYTE *)iEnd,&local_d8);
      }
      else {
        uVar11 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                           (ms,(BYTE *)piVar18,(BYTE *)iEnd,&local_d8);
      }
      uVar21 = uVar19;
      if (uVar19 < uVar11) {
        uVar21 = uVar11;
      }
      if (uVar21 < 4) {
        uVar19 = (long)piVar18 - (long)local_f0;
        piVar18 = (int *)((long)piVar18 + (uVar19 >> 8) + 1);
        ms->lazySkipping = (uint)(0x7ff < uVar19);
        uVar14 = local_a4;
      }
      else {
        piVar15 = piVar18;
        local_b8 = local_d8;
        if (uVar11 <= uVar19) {
          local_b8 = 1;
          piVar15 = local_c0;
        }
        local_38 = (ulong)(((int)local_48 + iVar17) - uVar9);
        local_40 = (ulong)(((int)local_50 + iVar17) - uVar9);
        iVar12 = (int)local_58;
        lVar23 = 0;
        local_c0 = piVar15;
        do {
          if (local_80 <= (int *)(lVar23 + (long)piVar18)) break;
          piVar20 = (int *)((long)piVar18 + lVar23 + 1);
          iVar22 = (int)lVar23;
          uVar8 = (int)local_40 + iVar22 + 1;
          piVar15 = (int *)(local_b0 + uVar8);
          if (uVar8 < (uint)local_d0) {
            piVar15 = (int *)(local_88 + (((iVar12 + iVar17) - uVar9) + iVar22));
          }
          if (((uint)((int)local_38 + iVar22) < 0xfffffffd) && (*piVar15 == *piVar20)) {
            mEnd = iEnd;
            if (uVar8 < (uint)local_d0) {
              mEnd = local_a0;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar18 + lVar23 + 5),(BYTE *)(piVar15 + 1),
                                (BYTE *)iEnd,(BYTE *)mEnd,local_98);
            if (sVar10 < 0xfffffffffffffffc) {
              uVar8 = 0x1f;
              if ((uint)local_b8 != 0) {
                for (; (uint)local_b8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              if ((int)((uVar8 ^ 0x1f) + (int)uVar21 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
                local_b8 = 1;
                uVar21 = sVar10 + 4;
                local_c0 = piVar20;
              }
            }
          }
          local_d8 = 999999999;
          if (local_a8 == 6) {
            uVar19 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                               (ms,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
          }
          else if (local_a8 == 5) {
            uVar19 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                               (ms,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
          }
          else {
            uVar19 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                               (ms,(BYTE *)piVar20,(BYTE *)iEnd,&local_d8);
          }
          bVar4 = true;
          if (3 < uVar19) {
            uVar8 = 0x1f;
            if ((uint)local_b8 != 0) {
              for (; (uint)local_b8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar22 = 0x1f;
            if ((uint)local_d8 != 0) {
              for (; (uint)local_d8 >> iVar22 == 0; iVar22 = iVar22 + -1) {
              }
            }
            if ((int)((uVar8 ^ 0x1f) + (int)uVar21 * 4 + -0x1b) < (int)uVar19 * 4 - iVar22) {
              bVar4 = false;
              local_b8 = local_d8;
              uVar21 = uVar19;
              local_c0 = piVar20;
            }
          }
          lVar23 = lVar23 + 1;
        } while (!bVar4);
        piVar18 = local_c0;
        uVar8 = uVar9;
        uVar14 = local_a4;
        if (3 < local_b8) {
          uVar19 = (long)local_c0 + (-(long)local_b0 - local_b8) + -0xfffffffd;
          pBVar13 = local_b0;
          pBVar16 = local_98;
          if ((uint)uVar19 < (uint)local_d0) {
            pBVar13 = local_90;
            pBVar16 = local_68;
          }
          if ((local_f0 < local_c0) && (uVar19 = uVar19 & 0xffffffff, pBVar16 < pBVar13 + uVar19)) {
            pBVar13 = pBVar13 + uVar19;
            do {
              piVar15 = (int *)((long)piVar18 + -1);
              pBVar13 = pBVar13 + -1;
              if ((*(BYTE *)piVar15 != *pBVar13) ||
                 (uVar21 = uVar21 + 1, piVar18 = piVar15, piVar15 <= local_f0)) break;
            } while (pBVar16 < pBVar13);
          }
          uVar8 = (int)local_b8 - 3;
          uVar14 = uVar9;
        }
        if (local_c8->maxNbSeq <=
            (ulong)((long)local_c8->sequences - (long)local_c8->sequencesStart >> 3)) {
LAB_001612a2:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468b,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_c8->maxNbLit) {
LAB_001612ff:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar19 = (long)piVar18 - (long)local_f0;
        pBVar16 = local_c8->lit;
        if (local_c8->litStart + local_c8->maxNbLit < pBVar16 + uVar19) {
LAB_0016131e:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468e,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iEnd < piVar18) {
LAB_001612e0:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x468f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_70 < piVar18) {
          ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_f0,(BYTE *)piVar18,(BYTE *)local_70);
        }
        else {
          uVar5 = *(undefined8 *)(local_f0 + 2);
          *(undefined8 *)pBVar16 = *(undefined8 *)local_f0;
          *(undefined8 *)(pBVar16 + 8) = uVar5;
          if (0x10 < uVar19) {
            pBVar16 = local_c8->lit;
            if ((BYTE *)0xffffffffffffffe0 < pBVar16 + 0x10 + (-0x10 - (long)(local_f0 + 4))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar5 = *(undefined8 *)(local_f0 + 6);
            *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_f0 + 4);
            *(undefined8 *)(pBVar16 + 0x18) = uVar5;
            if (0x20 < (long)uVar19) {
              lVar23 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_f0 + lVar23 + 0x20);
                uVar5 = puVar1[1];
                pBVar13 = pBVar16 + lVar23 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar5;
                puVar1 = (undefined8 *)((long)local_f0 + lVar23 + 0x30);
                uVar5 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar5;
                lVar23 = lVar23 + 0x20;
              } while (pBVar13 + 0x20 < pBVar16 + uVar19);
            }
          }
        }
        rep = local_60;
        psVar6 = local_c8;
        local_c8->lit = local_c8->lit + uVar19;
        if (0xffff < uVar19) {
          if (local_c8->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_c8->longLengthType = ZSTD_llt_literalLength;
          local_c8->longLengthPos =
               (U32)((ulong)((long)local_c8->sequences - (long)local_c8->sequencesStart) >> 3);
        }
        psVar3 = local_c8->sequences;
        psVar3->litLength = (U16)uVar19;
        psVar3->offBase = (U32)local_b8;
        if (uVar21 < 3) {
LAB_001612c1:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46aa,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar21 - 3) {
          if (local_c8->longLengthType != ZSTD_llt_none) {
LAB_0016133d:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46ad,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_c8->longLengthType = ZSTD_llt_matchLength;
          local_c8->longLengthPos =
               (U32)((ulong)((long)psVar3 - (long)local_c8->sequencesStart) >> 3);
        }
        psVar3->mlBase = (U16)(uVar21 - 3);
        local_c8->sequences = psVar3 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar18 = (int *)((long)piVar18 + uVar21);
        pBVar16 = local_90;
        local_f0 = piVar18;
        do {
          uVar9 = uVar8;
          if (local_80 < piVar18) break;
          uVar9 = ((int)piVar18 - (int)local_b0) - uVar14;
          pBVar13 = local_b0;
          if (uVar9 < (uint)local_d0) {
            pBVar13 = pBVar16;
          }
          if ((uVar9 - (uint)local_d0 < 0xfffffffd) && (*(int *)(pBVar13 + uVar9) == *piVar18)) {
            piVar15 = iEnd;
            if (uVar9 < (uint)local_d0) {
              piVar15 = local_a0;
            }
            sVar10 = ZSTD_count_2segments
                               ((BYTE *)(piVar18 + 1),(BYTE *)((long)(pBVar13 + uVar9) + 4),
                                (BYTE *)iEnd,(BYTE *)piVar15,local_98);
            if (psVar6->maxNbSeq <=
                (ulong)((long)psVar6->sequences - (long)psVar6->sequencesStart >> 3))
            goto LAB_001612a2;
            if (0x20000 < psVar6->maxNbLit) goto LAB_001612ff;
            pBVar16 = psVar6->lit;
            if (psVar6->litStart + psVar6->maxNbLit < pBVar16) goto LAB_0016131e;
            if (iEnd < local_f0) goto LAB_001612e0;
            if (local_70 < local_f0) {
              ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_f0,(BYTE *)local_f0,(BYTE *)local_70);
            }
            else {
              uVar5 = *(undefined8 *)(local_f0 + 2);
              *(undefined8 *)pBVar16 = *(undefined8 *)local_f0;
              *(undefined8 *)(pBVar16 + 8) = uVar5;
            }
            psVar3 = psVar6->sequences;
            psVar3->litLength = 0;
            psVar3->offBase = 1;
            if (sVar10 + 4 < 3) goto LAB_001612c1;
            if (0xffff < sVar10 + 1) {
              if (psVar6->longLengthType != ZSTD_llt_none) goto LAB_0016133d;
              psVar6->longLengthType = ZSTD_llt_matchLength;
              psVar6->longLengthPos =
                   (U32)((ulong)((long)psVar3 - (long)psVar6->sequencesStart) >> 3);
            }
            psVar3->mlBase = (U16)(sVar10 + 1);
            psVar6->sequences = psVar3 + 1;
            piVar18 = (int *)((long)piVar18 + sVar10 + 4);
            bVar4 = true;
            pBVar16 = local_90;
            uVar9 = uVar8;
            uVar8 = uVar14;
            local_f0 = piVar18;
          }
          else {
            bVar4 = false;
            uVar9 = uVar14;
          }
          uVar14 = uVar9;
          uVar9 = uVar8;
        } while (bVar4);
      }
    } while (piVar18 < local_80);
  }
  *rep = uVar9;
  rep[1] = uVar14;
  return (long)iEnd - (long)local_f0;
}

Assistant:

size_t ZSTD_compressBlock_lazy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dedicatedDictSearch);
}